

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O3

void __thiscall test::OWDTimeStatistics::PrintStatistics(OWDTimeStatistics *this)

{
  OWDTimeStatistics *pOVar1;
  ostringstream *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  ulong uVar19;
  OutputWorker *pOVar20;
  OWDTimeStatistics *pOVar21;
  OWDTimeStatistics *pOVar22;
  uint uVar23;
  unsigned_long __tmp;
  ulong uVar24;
  OWDTimeStatistics *pOVar25;
  unsigned_long uVar26;
  OWDTimeStatistics *pOVar27;
  OWDTimeStatistics *pOVar28;
  unsigned_long *__i_1;
  long lVar29;
  OWDTimeStatistics *pOVar30;
  unsigned_long __tmp_1;
  value_type_conflict __val_12;
  unsigned_long *__i;
  bool bVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM1 [16];
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1bc;
  undefined1 local_1b8 [392];
  
  uVar24 = (ulong)this->SampleCount;
  fVar32 = 0.0;
  if (200 < uVar24) {
    auVar18 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auVar18._0_8_ * 0.99;
    uVar19 = vcvttsd2usi_avx512f(auVar33);
    pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar19);
    if (uVar19 != uVar24) {
      uVar19 = (ulong)(uint)((int)LZCOUNT(uVar24) * 2) ^ 0x7e;
      pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar24);
      uVar24 = uVar24 << 3;
      pOVar22 = this;
      do {
        uVar24 = uVar24 >> 4;
        uVar3 = (pOVar22->Samples)._M_elems[1];
        uVar6._0_4_ = pOVar30[-1].SampleCount;
        uVar6._4_4_ = pOVar30[-1].SampleIndex;
        uVar4 = (pOVar22->Samples)._M_elems[uVar24];
        if (uVar3 < uVar4) {
          if (uVar4 < uVar6) {
            uVar26 = (pOVar22->Samples)._M_elems[0];
            (pOVar22->Samples)._M_elems[0] = uVar4;
            (pOVar22->Samples)._M_elems[uVar24] = uVar26;
          }
          else {
            uVar26 = (pOVar22->Samples)._M_elems[0];
            if (uVar6 <= uVar3) goto LAB_001076a7;
            (pOVar22->Samples)._M_elems[0] = uVar6;
            pOVar30[-1].SampleCount = (int)uVar26;
            pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
          }
        }
        else if (uVar3 < uVar6) {
          uVar26 = (pOVar22->Samples)._M_elems[0];
LAB_001076a7:
          (pOVar22->Samples)._M_elems[0] = uVar3;
          (pOVar22->Samples)._M_elems[1] = uVar26;
        }
        else {
          uVar26 = (pOVar22->Samples)._M_elems[0];
          if (uVar4 < uVar6) {
            (pOVar22->Samples)._M_elems[0] = uVar6;
            pOVar30[-1].SampleCount = (int)uVar26;
            pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
          }
          else {
            (pOVar22->Samples)._M_elems[0] = uVar4;
            (pOVar22->Samples)._M_elems[uVar24] = uVar26;
          }
        }
        uVar19 = uVar19 - 1;
        pOVar21 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1);
        pOVar27 = pOVar30;
        while( true ) {
          uVar24 = (pOVar22->Samples)._M_elems[0];
          do {
            pOVar25 = pOVar21;
            uVar3 = (pOVar25->Samples)._M_elems[0];
            pOVar21 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
          } while (uVar3 < uVar24);
          do {
            pOVar28 = pOVar27;
            uVar4._0_4_ = pOVar28[-1].SampleCount;
            uVar4._4_4_ = pOVar28[-1].SampleIndex;
            pOVar27 = (OWDTimeStatistics *)&pOVar28[-1].SampleCount;
          } while (uVar24 < uVar4);
          if (pOVar27 <= pOVar25) break;
          (pOVar25->Samples)._M_elems[0] = uVar4;
          pOVar28[-1].SampleCount = (int)uVar3;
          pOVar28[-1].SampleIndex = (int)(uVar3 >> 0x20);
        }
        if (pOVar25 <= pOVar1) {
          pOVar22 = pOVar25;
          pOVar25 = pOVar30;
        }
        pOVar30 = pOVar25;
        uVar24 = (long)pOVar30 - (long)pOVar22;
        if ((long)uVar24 < 0x19) {
          pOVar21 = pOVar22;
          if (pOVar22 != pOVar30) {
            while (pOVar27 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1),
                  pOVar27 != pOVar30) {
              uVar24 = (pOVar21->Samples)._M_elems[1];
              if (uVar24 < (pOVar22->Samples)._M_elems[0]) {
                memmove((void *)((long)pOVar21 + (0x10 - ((long)pOVar27 - (long)pOVar22))),pOVar22,
                        (long)pOVar27 - (long)pOVar22);
                pOVar21 = pOVar22;
              }
              else {
                uVar19 = (pOVar21->Samples)._M_elems[0];
                pOVar21 = pOVar27;
                while (uVar24 < uVar19) {
                  (pOVar21->Samples)._M_elems[0] = uVar19;
                  pOVar25 = pOVar21 + -1;
                  pOVar21 = (OWDTimeStatistics *)&pOVar21[-1].SampleCount;
                  uVar19 = (pOVar25->Samples)._M_elems[999];
                }
              }
              (pOVar21->Samples)._M_elems[0] = uVar24;
              pOVar21 = pOVar27;
            }
          }
          goto LAB_001077ec;
        }
      } while (uVar19 != 0);
      pOVar21 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
      lVar29 = (long)pOVar21 - (long)pOVar22 >> 3;
      if (1 < lVar29) {
        uVar24 = lVar29 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__0>>
                    (pOVar22,uVar24,lVar29,(pOVar22->Samples)._M_elems[uVar24]);
          bVar31 = uVar24 != 0;
          uVar24 = uVar24 - 1;
        } while (bVar31);
      }
      for (; pOVar21 < pOVar30; pOVar21 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1)) {
        uVar24 = (pOVar22->Samples)._M_elems[0];
        if ((pOVar21->Samples)._M_elems[0] < uVar24) {
          (pOVar21->Samples)._M_elems[0] = uVar24;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__0>>
                    (pOVar22,0,lVar29);
        }
      }
      uVar26 = (pOVar22->Samples)._M_elems[0];
      (pOVar22->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
      (pOVar1->Samples)._M_elems[0] = uVar26;
    }
LAB_001077ec:
    auVar18 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
    fVar32 = auVar18._0_4_;
    uVar24 = (ulong)this->SampleCount;
  }
  local_1bc = 0.0;
  uVar23 = (uint)uVar24;
  if (100 < uVar23) {
    auVar18 = vcvtusi2sd_avx512f(in_XMM1,uVar23);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auVar18._0_8_ * 0.95;
    uVar19 = vcvttsd2usi_avx512f(auVar34);
    pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar19);
    if (uVar19 != uVar24) {
      uVar19 = (ulong)(uint)((int)LZCOUNT(uVar24) * 2) ^ 0x7e;
      pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar24);
      uVar24 = uVar24 << 3;
      pOVar22 = this;
      do {
        uVar24 = uVar24 >> 4;
        uVar3 = (pOVar22->Samples)._M_elems[1];
        uVar5._0_4_ = pOVar30[-1].SampleCount;
        uVar5._4_4_ = pOVar30[-1].SampleIndex;
        uVar6 = (pOVar22->Samples)._M_elems[uVar24];
        if (uVar3 < uVar6) {
          if (uVar6 < uVar5) {
            uVar26 = (pOVar22->Samples)._M_elems[0];
            (pOVar22->Samples)._M_elems[0] = uVar6;
            (pOVar22->Samples)._M_elems[uVar24] = uVar26;
          }
          else {
            uVar26 = (pOVar22->Samples)._M_elems[0];
            if (uVar5 <= uVar3) goto LAB_00107889;
            (pOVar22->Samples)._M_elems[0] = uVar5;
            pOVar30[-1].SampleCount = (int)uVar26;
            pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
          }
        }
        else if (uVar3 < uVar5) {
          uVar26 = (pOVar22->Samples)._M_elems[0];
LAB_00107889:
          (pOVar22->Samples)._M_elems[0] = uVar3;
          (pOVar22->Samples)._M_elems[1] = uVar26;
        }
        else {
          uVar26 = (pOVar22->Samples)._M_elems[0];
          if (uVar6 < uVar5) {
            (pOVar22->Samples)._M_elems[0] = uVar5;
            pOVar30[-1].SampleCount = (int)uVar26;
            pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
          }
          else {
            (pOVar22->Samples)._M_elems[0] = uVar6;
            (pOVar22->Samples)._M_elems[uVar24] = uVar26;
          }
        }
        uVar19 = uVar19 - 1;
        pOVar21 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1);
        pOVar27 = pOVar30;
        while( true ) {
          uVar24 = (pOVar22->Samples)._M_elems[0];
          do {
            pOVar25 = pOVar21;
            uVar3 = (pOVar25->Samples)._M_elems[0];
            pOVar21 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
          } while (uVar3 < uVar24);
          do {
            pOVar28 = pOVar27;
            uVar7._0_4_ = pOVar28[-1].SampleCount;
            uVar7._4_4_ = pOVar28[-1].SampleIndex;
            pOVar27 = (OWDTimeStatistics *)&pOVar28[-1].SampleCount;
          } while (uVar24 < uVar7);
          if (pOVar27 <= pOVar25) break;
          (pOVar25->Samples)._M_elems[0] = uVar7;
          pOVar28[-1].SampleCount = (int)uVar3;
          pOVar28[-1].SampleIndex = (int)(uVar3 >> 0x20);
        }
        if (pOVar25 <= pOVar1) {
          pOVar22 = pOVar25;
          pOVar25 = pOVar30;
        }
        pOVar30 = pOVar25;
        uVar24 = (long)pOVar30 - (long)pOVar22;
        if ((long)uVar24 < 0x19) {
          pOVar21 = pOVar22;
          if (pOVar22 != pOVar30) {
            while (pOVar27 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1),
                  pOVar27 != pOVar30) {
              uVar24 = (pOVar21->Samples)._M_elems[1];
              if (uVar24 < (pOVar22->Samples)._M_elems[0]) {
                memmove((void *)((long)pOVar21 + (0x10 - ((long)pOVar27 - (long)pOVar22))),pOVar22,
                        (long)pOVar27 - (long)pOVar22);
                pOVar21 = pOVar22;
              }
              else {
                uVar19 = (pOVar21->Samples)._M_elems[0];
                pOVar21 = pOVar27;
                while (uVar24 < uVar19) {
                  (pOVar21->Samples)._M_elems[0] = uVar19;
                  pOVar25 = pOVar21 + -1;
                  pOVar21 = (OWDTimeStatistics *)&pOVar21[-1].SampleCount;
                  uVar19 = (pOVar25->Samples)._M_elems[999];
                }
              }
              (pOVar21->Samples)._M_elems[0] = uVar24;
              pOVar21 = pOVar27;
            }
          }
          goto LAB_001079ce;
        }
      } while (uVar19 != 0);
      pOVar21 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
      lVar29 = (long)pOVar21 - (long)pOVar22 >> 3;
      if (1 < lVar29) {
        uVar24 = lVar29 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__1>>
                    (pOVar22,uVar24,lVar29,(pOVar22->Samples)._M_elems[uVar24]);
          bVar31 = uVar24 != 0;
          uVar24 = uVar24 - 1;
        } while (bVar31);
      }
      for (; pOVar21 < pOVar30; pOVar21 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1)) {
        uVar24 = (pOVar22->Samples)._M_elems[0];
        if ((pOVar21->Samples)._M_elems[0] < uVar24) {
          (pOVar21->Samples)._M_elems[0] = uVar24;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__1>>
                    (pOVar22,0,lVar29);
        }
      }
      uVar26 = (pOVar22->Samples)._M_elems[0];
      (pOVar22->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
      (pOVar1->Samples)._M_elems[0] = uVar26;
    }
LAB_001079ce:
    auVar18 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
    uVar23 = this->SampleCount;
    local_1bc = auVar18._0_4_;
  }
  local_1c8 = 0.0;
  if (uVar23 < 5) {
    local_1cc = 0.0;
    local_1c4 = 0.0;
  }
  else {
    auVar18 = vcvtusi2sd_avx512f(in_XMM1,uVar23);
    uVar19 = (ulong)uVar23;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = auVar18._0_8_ * 0.75;
    uVar24 = vcvttsd2usi_avx512f(auVar35);
    pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar24);
    if (uVar24 != uVar19) {
      uVar24 = (ulong)(uint)((int)LZCOUNT(uVar19) * 2) ^ 0x7e;
      pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar19);
      uVar19 = uVar19 << 3;
      pOVar22 = this;
      do {
        uVar19 = uVar19 >> 4;
        uVar3 = (pOVar22->Samples)._M_elems[1];
        uVar8._0_4_ = pOVar30[-1].SampleCount;
        uVar8._4_4_ = pOVar30[-1].SampleIndex;
        uVar6 = (pOVar22->Samples)._M_elems[uVar19];
        if (uVar3 < uVar6) {
          if (uVar6 < uVar8) {
            uVar26 = (pOVar22->Samples)._M_elems[0];
            (pOVar22->Samples)._M_elems[0] = uVar6;
            (pOVar22->Samples)._M_elems[uVar19] = uVar26;
          }
          else {
            uVar26 = (pOVar22->Samples)._M_elems[0];
            if (uVar8 <= uVar3) goto LAB_00107a75;
            (pOVar22->Samples)._M_elems[0] = uVar8;
            pOVar30[-1].SampleCount = (int)uVar26;
            pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
          }
        }
        else if (uVar3 < uVar8) {
          uVar26 = (pOVar22->Samples)._M_elems[0];
LAB_00107a75:
          (pOVar22->Samples)._M_elems[0] = uVar3;
          (pOVar22->Samples)._M_elems[1] = uVar26;
        }
        else {
          uVar26 = (pOVar22->Samples)._M_elems[0];
          if (uVar6 < uVar8) {
            (pOVar22->Samples)._M_elems[0] = uVar8;
            pOVar30[-1].SampleCount = (int)uVar26;
            pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
          }
          else {
            (pOVar22->Samples)._M_elems[0] = uVar6;
            (pOVar22->Samples)._M_elems[uVar19] = uVar26;
          }
        }
        uVar24 = uVar24 - 1;
        pOVar21 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1);
        pOVar27 = pOVar30;
        while( true ) {
          uVar19 = (pOVar22->Samples)._M_elems[0];
          do {
            pOVar25 = pOVar21;
            uVar3 = (pOVar25->Samples)._M_elems[0];
            pOVar21 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
          } while (uVar3 < uVar19);
          do {
            pOVar28 = pOVar27;
            uVar9._0_4_ = pOVar28[-1].SampleCount;
            uVar9._4_4_ = pOVar28[-1].SampleIndex;
            pOVar27 = (OWDTimeStatistics *)&pOVar28[-1].SampleCount;
          } while (uVar19 < uVar9);
          if (pOVar27 <= pOVar25) break;
          (pOVar25->Samples)._M_elems[0] = uVar9;
          pOVar28[-1].SampleCount = (int)uVar3;
          pOVar28[-1].SampleIndex = (int)(uVar3 >> 0x20);
        }
        if (pOVar25 <= pOVar1) {
          pOVar22 = pOVar25;
          pOVar25 = pOVar30;
        }
        pOVar30 = pOVar25;
        uVar19 = (long)pOVar30 - (long)pOVar22;
        if ((long)uVar19 < 0x19) {
          pOVar21 = pOVar22;
          if (pOVar22 != pOVar30) {
            while (pOVar27 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1),
                  pOVar27 != pOVar30) {
              uVar24 = (pOVar21->Samples)._M_elems[1];
              if (uVar24 < (pOVar22->Samples)._M_elems[0]) {
                memmove((void *)((long)pOVar21 + (0x10 - ((long)pOVar27 - (long)pOVar22))),pOVar22,
                        (long)pOVar27 - (long)pOVar22);
                pOVar21 = pOVar22;
              }
              else {
                uVar19 = (pOVar21->Samples)._M_elems[0];
                pOVar21 = pOVar27;
                while (uVar24 < uVar19) {
                  (pOVar21->Samples)._M_elems[0] = uVar19;
                  pOVar25 = pOVar21 + -1;
                  pOVar21 = (OWDTimeStatistics *)&pOVar21[-1].SampleCount;
                  uVar19 = (pOVar25->Samples)._M_elems[999];
                }
              }
              (pOVar21->Samples)._M_elems[0] = uVar24;
              pOVar21 = pOVar27;
            }
          }
          goto LAB_00107bd5;
        }
      } while (uVar24 != 0);
      pOVar21 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
      lVar29 = (long)pOVar21 - (long)pOVar22 >> 3;
      if (1 < lVar29) {
        uVar24 = lVar29 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__2>>
                    (pOVar22,uVar24,lVar29,(pOVar22->Samples)._M_elems[uVar24]);
          bVar31 = uVar24 != 0;
          uVar24 = uVar24 - 1;
        } while (bVar31);
      }
      for (; pOVar21 < pOVar30; pOVar21 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1)) {
        uVar24 = (pOVar22->Samples)._M_elems[0];
        if ((pOVar21->Samples)._M_elems[0] < uVar24) {
          (pOVar21->Samples)._M_elems[0] = uVar24;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__2>>
                    (pOVar22,0,lVar29);
        }
      }
      uVar26 = (pOVar22->Samples)._M_elems[0];
      (pOVar22->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
      (pOVar1->Samples)._M_elems[0] = uVar26;
    }
LAB_00107bd5:
    auVar18 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
    uVar24 = (ulong)this->SampleCount;
    local_1c4 = auVar18._0_4_;
    if (uVar24 < 5) {
      local_1cc = 0.0;
    }
    else {
      auVar18 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = auVar18._0_8_ * 0.5;
      uVar19 = vcvttsd2usi_avx512f(auVar36);
      pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar19);
      if (uVar19 != uVar24) {
        uVar19 = (ulong)(uint)((int)LZCOUNT(uVar24) * 2) ^ 0x7e;
        pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar24);
        uVar24 = uVar24 << 3;
        pOVar22 = this;
        do {
          uVar24 = uVar24 >> 4;
          uVar3 = (pOVar22->Samples)._M_elems[1];
          uVar10._0_4_ = pOVar30[-1].SampleCount;
          uVar10._4_4_ = pOVar30[-1].SampleIndex;
          uVar6 = (pOVar22->Samples)._M_elems[uVar24];
          if (uVar3 < uVar6) {
            if (uVar6 < uVar10) {
              uVar26 = (pOVar22->Samples)._M_elems[0];
              (pOVar22->Samples)._M_elems[0] = uVar6;
              (pOVar22->Samples)._M_elems[uVar24] = uVar26;
            }
            else {
              uVar26 = (pOVar22->Samples)._M_elems[0];
              if (uVar10 <= uVar3) goto LAB_00107c71;
              (pOVar22->Samples)._M_elems[0] = uVar10;
              pOVar30[-1].SampleCount = (int)uVar26;
              pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
            }
          }
          else if (uVar3 < uVar10) {
            uVar26 = (pOVar22->Samples)._M_elems[0];
LAB_00107c71:
            (pOVar22->Samples)._M_elems[0] = uVar3;
            (pOVar22->Samples)._M_elems[1] = uVar26;
          }
          else {
            uVar26 = (pOVar22->Samples)._M_elems[0];
            if (uVar6 < uVar10) {
              (pOVar22->Samples)._M_elems[0] = uVar10;
              pOVar30[-1].SampleCount = (int)uVar26;
              pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
            }
            else {
              (pOVar22->Samples)._M_elems[0] = uVar6;
              (pOVar22->Samples)._M_elems[uVar24] = uVar26;
            }
          }
          uVar19 = uVar19 - 1;
          pOVar21 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1);
          pOVar27 = pOVar30;
          while( true ) {
            uVar24 = (pOVar22->Samples)._M_elems[0];
            do {
              pOVar25 = pOVar21;
              uVar3 = (pOVar25->Samples)._M_elems[0];
              pOVar21 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
            } while (uVar3 < uVar24);
            do {
              pOVar28 = pOVar27;
              uVar11._0_4_ = pOVar28[-1].SampleCount;
              uVar11._4_4_ = pOVar28[-1].SampleIndex;
              pOVar27 = (OWDTimeStatistics *)&pOVar28[-1].SampleCount;
            } while (uVar24 < uVar11);
            if (pOVar27 <= pOVar25) break;
            (pOVar25->Samples)._M_elems[0] = uVar11;
            pOVar28[-1].SampleCount = (int)uVar3;
            pOVar28[-1].SampleIndex = (int)(uVar3 >> 0x20);
          }
          if (pOVar25 <= pOVar1) {
            pOVar22 = pOVar25;
            pOVar25 = pOVar30;
          }
          pOVar30 = pOVar25;
          uVar24 = (long)pOVar30 - (long)pOVar22;
          if ((long)uVar24 < 0x19) {
            pOVar21 = pOVar22;
            if (pOVar22 != pOVar30) {
              while (pOVar27 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1),
                    pOVar27 != pOVar30) {
                uVar24 = (pOVar21->Samples)._M_elems[1];
                if (uVar24 < (pOVar22->Samples)._M_elems[0]) {
                  memmove((void *)((long)pOVar21 + (0x10 - ((long)pOVar27 - (long)pOVar22))),pOVar22
                          ,(long)pOVar27 - (long)pOVar22);
                  pOVar21 = pOVar22;
                }
                else {
                  uVar19 = (pOVar21->Samples)._M_elems[0];
                  pOVar21 = pOVar27;
                  while (uVar24 < uVar19) {
                    (pOVar21->Samples)._M_elems[0] = uVar19;
                    pOVar25 = pOVar21 + -1;
                    pOVar21 = (OWDTimeStatistics *)&pOVar21[-1].SampleCount;
                    uVar19 = (pOVar25->Samples)._M_elems[999];
                  }
                }
                (pOVar21->Samples)._M_elems[0] = uVar24;
                pOVar21 = pOVar27;
              }
            }
            goto LAB_00107dcf;
          }
        } while (uVar19 != 0);
        pOVar21 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
        lVar29 = (long)pOVar21 - (long)pOVar22 >> 3;
        if (1 < lVar29) {
          uVar24 = lVar29 - 2U >> 1;
          do {
            std::
            __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__3>>
                      (pOVar22,uVar24,lVar29,(pOVar22->Samples)._M_elems[uVar24]);
            bVar31 = uVar24 != 0;
            uVar24 = uVar24 - 1;
          } while (bVar31);
        }
        for (; pOVar21 < pOVar30; pOVar21 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1))
        {
          uVar24 = (pOVar22->Samples)._M_elems[0];
          if ((pOVar21->Samples)._M_elems[0] < uVar24) {
            (pOVar21->Samples)._M_elems[0] = uVar24;
            std::
            __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__3>>
                      (pOVar22,0,lVar29);
          }
        }
        uVar26 = (pOVar22->Samples)._M_elems[0];
        (pOVar22->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
        (pOVar1->Samples)._M_elems[0] = uVar26;
      }
LAB_00107dcf:
      auVar18 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
      uVar24 = (ulong)this->SampleCount;
      local_1cc = auVar18._0_4_;
      if (8 < uVar24) {
        auVar18 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = auVar18._0_8_ * 0.25;
        uVar19 = vcvttsd2usi_avx512f(auVar37);
        pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar19);
        if (uVar19 != uVar24) {
          uVar19 = (ulong)(uint)((int)LZCOUNT(uVar24) * 2) ^ 0x7e;
          pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar24);
          uVar24 = uVar24 << 3;
          pOVar22 = this;
          do {
            uVar24 = uVar24 >> 4;
            uVar3 = (pOVar22->Samples)._M_elems[1];
            uVar12._0_4_ = pOVar30[-1].SampleCount;
            uVar12._4_4_ = pOVar30[-1].SampleIndex;
            uVar6 = (pOVar22->Samples)._M_elems[uVar24];
            if (uVar3 < uVar6) {
              if (uVar6 < uVar12) {
                uVar26 = (pOVar22->Samples)._M_elems[0];
                (pOVar22->Samples)._M_elems[0] = uVar6;
                (pOVar22->Samples)._M_elems[uVar24] = uVar26;
              }
              else {
                uVar26 = (pOVar22->Samples)._M_elems[0];
                if (uVar12 <= uVar3) goto LAB_00107e6b;
                (pOVar22->Samples)._M_elems[0] = uVar12;
                pOVar30[-1].SampleCount = (int)uVar26;
                pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
              }
            }
            else if (uVar3 < uVar12) {
              uVar26 = (pOVar22->Samples)._M_elems[0];
LAB_00107e6b:
              (pOVar22->Samples)._M_elems[0] = uVar3;
              (pOVar22->Samples)._M_elems[1] = uVar26;
            }
            else {
              uVar26 = (pOVar22->Samples)._M_elems[0];
              if (uVar6 < uVar12) {
                (pOVar22->Samples)._M_elems[0] = uVar12;
                pOVar30[-1].SampleCount = (int)uVar26;
                pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
              }
              else {
                (pOVar22->Samples)._M_elems[0] = uVar6;
                (pOVar22->Samples)._M_elems[uVar24] = uVar26;
              }
            }
            uVar19 = uVar19 - 1;
            pOVar21 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1);
            pOVar27 = pOVar30;
            while( true ) {
              uVar24 = (pOVar22->Samples)._M_elems[0];
              do {
                pOVar25 = pOVar21;
                uVar3 = (pOVar25->Samples)._M_elems[0];
                pOVar21 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
              } while (uVar3 < uVar24);
              do {
                pOVar28 = pOVar27;
                uVar13._0_4_ = pOVar28[-1].SampleCount;
                uVar13._4_4_ = pOVar28[-1].SampleIndex;
                pOVar27 = (OWDTimeStatistics *)&pOVar28[-1].SampleCount;
              } while (uVar24 < uVar13);
              if (pOVar27 <= pOVar25) break;
              (pOVar25->Samples)._M_elems[0] = uVar13;
              pOVar28[-1].SampleCount = (int)uVar3;
              pOVar28[-1].SampleIndex = (int)(uVar3 >> 0x20);
            }
            if (pOVar25 <= pOVar1) {
              pOVar22 = pOVar25;
              pOVar25 = pOVar30;
            }
            pOVar30 = pOVar25;
            uVar24 = (long)pOVar30 - (long)pOVar22;
            if ((long)uVar24 < 0x19) {
              pOVar21 = pOVar22;
              if (pOVar22 != pOVar30) {
                while (pOVar27 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1),
                      pOVar27 != pOVar30) {
                  uVar24 = (pOVar21->Samples)._M_elems[1];
                  if (uVar24 < (pOVar22->Samples)._M_elems[0]) {
                    memmove((void *)((long)pOVar21 + (0x10 - ((long)pOVar27 - (long)pOVar22))),
                            pOVar22,(long)pOVar27 - (long)pOVar22);
                    pOVar21 = pOVar22;
                  }
                  else {
                    uVar19 = (pOVar21->Samples)._M_elems[0];
                    pOVar21 = pOVar27;
                    while (uVar24 < uVar19) {
                      (pOVar21->Samples)._M_elems[0] = uVar19;
                      pOVar25 = pOVar21 + -1;
                      pOVar21 = (OWDTimeStatistics *)&pOVar21[-1].SampleCount;
                      uVar19 = (pOVar25->Samples)._M_elems[999];
                    }
                  }
                  (pOVar21->Samples)._M_elems[0] = uVar24;
                  pOVar21 = pOVar27;
                }
              }
              goto LAB_001084be;
            }
          } while (uVar19 != 0);
          pOVar21 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
          lVar29 = (long)pOVar21 - (long)pOVar22 >> 3;
          if (1 < lVar29) {
            uVar24 = lVar29 - 2U >> 1;
            do {
              std::
              __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__4>>
                        (pOVar22,uVar24,lVar29,(pOVar22->Samples)._M_elems[uVar24]);
              bVar31 = uVar24 != 0;
              uVar24 = uVar24 - 1;
            } while (bVar31);
          }
          for (; pOVar21 < pOVar30; pOVar21 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1)
              ) {
            uVar24 = (pOVar22->Samples)._M_elems[0];
            if ((pOVar21->Samples)._M_elems[0] < uVar24) {
              (pOVar21->Samples)._M_elems[0] = uVar24;
              std::
              __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__4>>
                        (pOVar22,0,lVar29);
            }
          }
          uVar26 = (pOVar22->Samples)._M_elems[0];
          (pOVar22->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
          (pOVar1->Samples)._M_elems[0] = uVar26;
        }
LAB_001084be:
        auVar18 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
        uVar24 = (ulong)this->SampleCount;
        local_1d0 = auVar18._0_4_;
        if (uVar24 < 0x29) {
          local_1d4 = 0.0;
        }
        else {
          auVar18 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = auVar18._0_8_ * 0.05;
          uVar19 = vcvttsd2usi_avx512f(auVar38);
          pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar19);
          if (uVar19 != uVar24) {
            uVar19 = (ulong)(uint)((int)LZCOUNT(uVar24) * 2) ^ 0x7e;
            pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar24);
            uVar24 = uVar24 << 3;
            pOVar22 = this;
            do {
              uVar24 = uVar24 >> 4;
              uVar3 = (pOVar22->Samples)._M_elems[1];
              uVar14._0_4_ = pOVar30[-1].SampleCount;
              uVar14._4_4_ = pOVar30[-1].SampleIndex;
              uVar6 = (pOVar22->Samples)._M_elems[uVar24];
              if (uVar3 < uVar6) {
                if (uVar6 < uVar14) {
                  uVar26 = (pOVar22->Samples)._M_elems[0];
                  (pOVar22->Samples)._M_elems[0] = uVar6;
                  (pOVar22->Samples)._M_elems[uVar24] = uVar26;
                }
                else {
                  uVar26 = (pOVar22->Samples)._M_elems[0];
                  if (uVar14 <= uVar3) goto LAB_0010855a;
                  (pOVar22->Samples)._M_elems[0] = uVar14;
                  pOVar30[-1].SampleCount = (int)uVar26;
                  pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
                }
              }
              else if (uVar3 < uVar14) {
                uVar26 = (pOVar22->Samples)._M_elems[0];
LAB_0010855a:
                (pOVar22->Samples)._M_elems[0] = uVar3;
                (pOVar22->Samples)._M_elems[1] = uVar26;
              }
              else {
                uVar26 = (pOVar22->Samples)._M_elems[0];
                if (uVar6 < uVar14) {
                  (pOVar22->Samples)._M_elems[0] = uVar14;
                  pOVar30[-1].SampleCount = (int)uVar26;
                  pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
                }
                else {
                  (pOVar22->Samples)._M_elems[0] = uVar6;
                  (pOVar22->Samples)._M_elems[uVar24] = uVar26;
                }
              }
              uVar19 = uVar19 - 1;
              pOVar21 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1);
              pOVar27 = pOVar30;
              while( true ) {
                uVar24 = (pOVar22->Samples)._M_elems[0];
                do {
                  pOVar25 = pOVar21;
                  uVar3 = (pOVar25->Samples)._M_elems[0];
                  pOVar21 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
                } while (uVar3 < uVar24);
                do {
                  pOVar28 = pOVar27;
                  uVar15._0_4_ = pOVar28[-1].SampleCount;
                  uVar15._4_4_ = pOVar28[-1].SampleIndex;
                  pOVar27 = (OWDTimeStatistics *)&pOVar28[-1].SampleCount;
                } while (uVar24 < uVar15);
                if (pOVar27 <= pOVar25) break;
                (pOVar25->Samples)._M_elems[0] = uVar15;
                pOVar28[-1].SampleCount = (int)uVar3;
                pOVar28[-1].SampleIndex = (int)(uVar3 >> 0x20);
              }
              if (pOVar25 <= pOVar1) {
                pOVar22 = pOVar25;
                pOVar25 = pOVar30;
              }
              pOVar30 = pOVar25;
              uVar24 = (long)pOVar30 - (long)pOVar22;
              if ((long)uVar24 < 0x19) {
                pOVar21 = pOVar22;
                if (pOVar22 != pOVar30) {
                  while (pOVar27 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1),
                        pOVar27 != pOVar30) {
                    uVar24 = (pOVar21->Samples)._M_elems[1];
                    if (uVar24 < (pOVar22->Samples)._M_elems[0]) {
                      memmove((void *)((long)pOVar21 + (0x10 - ((long)pOVar27 - (long)pOVar22))),
                              pOVar22,(long)pOVar27 - (long)pOVar22);
                      pOVar21 = pOVar22;
                    }
                    else {
                      uVar19 = (pOVar21->Samples)._M_elems[0];
                      pOVar21 = pOVar27;
                      while (uVar24 < uVar19) {
                        (pOVar21->Samples)._M_elems[0] = uVar19;
                        pOVar25 = pOVar21 + -1;
                        pOVar21 = (OWDTimeStatistics *)&pOVar21[-1].SampleCount;
                        uVar19 = (pOVar25->Samples)._M_elems[999];
                      }
                    }
                    (pOVar21->Samples)._M_elems[0] = uVar24;
                    pOVar21 = pOVar27;
                  }
                }
                goto LAB_001086b2;
              }
            } while (uVar19 != 0);
            pOVar21 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
            lVar29 = (long)pOVar21 - (long)pOVar22 >> 3;
            if (1 < lVar29) {
              uVar24 = lVar29 - 2U >> 1;
              do {
                std::
                __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__5>>
                          (pOVar22,uVar24,lVar29,(pOVar22->Samples)._M_elems[uVar24]);
                bVar31 = uVar24 != 0;
                uVar24 = uVar24 - 1;
              } while (bVar31);
            }
            for (; pOVar21 < pOVar30;
                pOVar21 = (OWDTimeStatistics *)((pOVar21->Samples)._M_elems + 1)) {
              uVar24 = (pOVar22->Samples)._M_elems[0];
              if ((pOVar21->Samples)._M_elems[0] < uVar24) {
                (pOVar21->Samples)._M_elems[0] = uVar24;
                std::
                __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__5>>
                          (pOVar22,0,lVar29);
              }
            }
            uVar26 = (pOVar22->Samples)._M_elems[0];
            (pOVar22->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
            (pOVar1->Samples)._M_elems[0] = uVar26;
          }
LAB_001086b2:
          auVar18 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
          uVar24 = (ulong)this->SampleCount;
          local_1d4 = auVar18._0_4_;
          if (200 < uVar24) {
            auVar18 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
            auVar39._8_8_ = 0;
            auVar39._0_8_ = auVar18._0_8_ * 0.01;
            uVar19 = vcvttsd2usi_avx512f(auVar39);
            pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar19);
            if (uVar19 != uVar24) {
              pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar24);
              uVar19 = uVar24 << 3;
              uVar24 = (ulong)(uint)((int)LZCOUNT(uVar24) * 2) ^ 0x7e;
              do {
                uVar19 = uVar19 >> 4;
                uVar3 = (this->Samples)._M_elems[1];
                uVar16._0_4_ = pOVar30[-1].SampleCount;
                uVar16._4_4_ = pOVar30[-1].SampleIndex;
                uVar6 = (this->Samples)._M_elems[uVar19];
                if (uVar3 < uVar6) {
                  if (uVar6 < uVar16) {
                    uVar26 = (this->Samples)._M_elems[0];
                    (this->Samples)._M_elems[0] = uVar6;
                    (this->Samples)._M_elems[uVar19] = uVar26;
                  }
                  else {
                    uVar26 = (this->Samples)._M_elems[0];
                    if (uVar16 <= uVar3) goto LAB_00108755;
                    (this->Samples)._M_elems[0] = uVar16;
                    pOVar30[-1].SampleCount = (int)uVar26;
                    pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
                  }
                }
                else if (uVar3 < uVar16) {
                  uVar26 = (this->Samples)._M_elems[0];
LAB_00108755:
                  (this->Samples)._M_elems[0] = uVar3;
                  (this->Samples)._M_elems[1] = uVar26;
                }
                else {
                  uVar26 = (this->Samples)._M_elems[0];
                  if (uVar6 < uVar16) {
                    (this->Samples)._M_elems[0] = uVar16;
                    pOVar30[-1].SampleCount = (int)uVar26;
                    pOVar30[-1].SampleIndex = (int)(uVar26 >> 0x20);
                  }
                  else {
                    (this->Samples)._M_elems[0] = uVar6;
                    (this->Samples)._M_elems[uVar19] = uVar26;
                  }
                }
                uVar24 = uVar24 - 1;
                pOVar22 = (OWDTimeStatistics *)((this->Samples)._M_elems + 1);
                pOVar21 = pOVar30;
                while( true ) {
                  uVar19 = (this->Samples)._M_elems[0];
                  do {
                    pOVar27 = pOVar22;
                    uVar3 = (pOVar27->Samples)._M_elems[0];
                    pOVar22 = (OWDTimeStatistics *)((pOVar27->Samples)._M_elems + 1);
                  } while (uVar3 < uVar19);
                  do {
                    pOVar25 = pOVar21;
                    uVar17._0_4_ = pOVar25[-1].SampleCount;
                    uVar17._4_4_ = pOVar25[-1].SampleIndex;
                    pOVar21 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
                  } while (uVar19 < uVar17);
                  if (pOVar21 <= pOVar27) break;
                  (pOVar27->Samples)._M_elems[0] = uVar17;
                  pOVar25[-1].SampleCount = (int)uVar3;
                  pOVar25[-1].SampleIndex = (int)(uVar3 >> 0x20);
                }
                if (pOVar27 <= pOVar1) {
                  this = pOVar27;
                  pOVar27 = pOVar30;
                }
                pOVar30 = pOVar27;
                uVar19 = (long)pOVar30 - (long)this;
                if ((long)uVar19 < 0x19) {
                  pOVar22 = this;
                  if (this != pOVar30) {
                    while (pOVar21 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1),
                          pOVar21 != pOVar30) {
                      uVar24 = (pOVar22->Samples)._M_elems[1];
                      if (uVar24 < (this->Samples)._M_elems[0]) {
                        memmove((void *)((long)pOVar22 + (0x10 - ((long)pOVar21 - (long)this))),this
                                ,(long)pOVar21 - (long)this);
                        pOVar22 = this;
                      }
                      else {
                        uVar19 = (pOVar22->Samples)._M_elems[0];
                        pOVar22 = pOVar21;
                        while (uVar24 < uVar19) {
                          (pOVar22->Samples)._M_elems[0] = uVar19;
                          pOVar27 = pOVar22 + -1;
                          pOVar22 = (OWDTimeStatistics *)&pOVar22[-1].SampleCount;
                          uVar19 = (pOVar27->Samples)._M_elems[999];
                        }
                      }
                      (pOVar22->Samples)._M_elems[0] = uVar24;
                      pOVar22 = pOVar21;
                    }
                  }
                  goto LAB_001088a6;
                }
              } while (uVar24 != 0);
              pOVar22 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
              lVar29 = (long)pOVar22 - (long)this >> 3;
              if (1 < lVar29) {
                uVar24 = lVar29 - 2U >> 1;
                do {
                  std::
                  __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__6>>
                            (this,uVar24,lVar29,(this->Samples)._M_elems[uVar24]);
                  bVar31 = uVar24 != 0;
                  uVar24 = uVar24 - 1;
                } while (bVar31);
              }
              for (; pOVar22 < pOVar30;
                  pOVar22 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1)) {
                uVar24 = (this->Samples)._M_elems[0];
                if ((pOVar22->Samples)._M_elems[0] < uVar24) {
                  (pOVar22->Samples)._M_elems[0] = uVar24;
                  std::
                  __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__6>>
                            (this,0,lVar29);
                }
              }
              uVar26 = (this->Samples)._M_elems[0];
              (this->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
              (pOVar1->Samples)._M_elems[0] = uVar26;
            }
LAB_001088a6:
            auVar18 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
            local_1c8 = auVar18._0_4_;
          }
        }
        goto LAB_00107f63;
      }
    }
  }
  local_1d4 = 0.0;
  local_1d0 = 0.0;
LAB_00107f63:
  if (DAT_00110280 < 3) {
    poVar2 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,DAT_001102b0,DAT_001102b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"One-way  1% percentile latency = ",0x21);
    std::ostream::_M_insert<double>((double)(fVar32 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," msec",5);
    pOVar20 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar20,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    if (DAT_00110280 < 3) {
      poVar2 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger;
      local_1b8._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,DAT_001102b0,DAT_001102b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"One-way  5% percentile latency = ",0x21);
      std::ostream::_M_insert<double>((double)(local_1bc / 1000.0));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," msec",5);
      pOVar20 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar20,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      if (DAT_00110280 < 3) {
        poVar2 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger;
        local_1b8._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,DAT_001102b0,DAT_001102b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"One-way 25% percentile latency = ",0x21);
        std::ostream::_M_insert<double>((double)(local_1c4 / 1000.0));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," msec",5);
        pOVar20 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar20,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
        if (DAT_00110280 < 3) {
          poVar2 = (ostringstream *)(local_1b8 + 0x10);
          local_1b8._0_8_ = Logger;
          local_1b8._8_4_ = Info;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,DAT_001102b0,DAT_001102b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"One-way 50% percentile latency = ",0x21);
          std::ostream::_M_insert<double>((double)(local_1cc / 1000.0));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," msec (median)",0xe)
          ;
          pOVar20 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar20,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
          if (DAT_00110280 < 3) {
            poVar2 = (ostringstream *)(local_1b8 + 0x10);
            local_1b8._0_8_ = Logger;
            local_1b8._8_4_ = Info;
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,DAT_001102b0,DAT_001102b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"One-way 75% percentile latency = ",0x21);
            std::ostream::_M_insert<double>((double)(local_1d0 / 1000.0));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," msec",5);
            pOVar20 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar20,(LogStringBuffer *)local_1b8);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
            if (DAT_00110280 < 3) {
              poVar2 = (ostringstream *)(local_1b8 + 0x10);
              local_1b8._0_8_ = Logger;
              local_1b8._8_4_ = Info;
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,DAT_001102b0,DAT_001102b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"One-way 95% percentile latency = ",0x21);
              std::ostream::_M_insert<double>((double)(local_1d4 / 1000.0));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," msec",5);
              pOVar20 = logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(pOVar20,(LogStringBuffer *)local_1b8);
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
              if (DAT_00110280 < 3) {
                poVar2 = (ostringstream *)(local_1b8 + 0x10);
                local_1b8._0_8_ = Logger;
                local_1b8._8_4_ = Info;
                std::__cxx11::ostringstream::ostringstream(poVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,DAT_001102b0,DAT_001102b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,"One-way 99% percentile latency = ",0x21);
                std::ostream::_M_insert<double>((double)(local_1c8 / 1000.0));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," msec",5);
                pOVar20 = logger::OutputWorker::GetInstance();
                logger::OutputWorker::Write(pOVar20,(LogStringBuffer *)local_1b8);
                std::__cxx11::ostringstream::~ostringstream(poVar2);
                std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void OWDTimeStatistics::PrintStatistics()
{
    uint64_t percentile1 = 0;
    if (SampleCount > 200)
    {
        offset_t goalOffset = (offset_t)(0.99 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile1 = Samples[goalOffset];
    }

    uint64_t percentile5 = 0;
    if (SampleCount > 100)
    {
        offset_t goalOffset = (offset_t)(0.95 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile5 = Samples[goalOffset];
    }

    uint64_t percentile25 = 0;
    if (SampleCount > 4)
    {
        offset_t goalOffset = (offset_t)(0.75 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile25 = Samples[goalOffset];
    }

    uint64_t percentile50 = 0;
    if (SampleCount > 4)
    {
        offset_t goalOffset = (offset_t)(0.5 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile50 = Samples[goalOffset];
    }

    uint64_t percentile75 = 0;
    if (SampleCount > 8)
    {
        offset_t goalOffset = (offset_t)(0.25 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile75 = Samples[goalOffset];
    }

    uint64_t percentile95 = 0;
    if (SampleCount > 40)
    {
        offset_t goalOffset = (offset_t)(0.05 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile95 = Samples[goalOffset];
    }

    uint64_t percentile99 = 0;
    if (SampleCount > 200)
    {
        offset_t goalOffset = (offset_t)(0.01 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile99 = Samples[goalOffset];
    }

    Logger.Info("One-way  1% percentile latency = ", percentile1 / 1000.f, " msec");
    Logger.Info("One-way  5% percentile latency = ", percentile5 / 1000.f, " msec");
    Logger.Info("One-way 25% percentile latency = ", percentile25 / 1000.f, " msec");
    Logger.Info("One-way 50% percentile latency = ", percentile50 / 1000.f, " msec (median)");
    Logger.Info("One-way 75% percentile latency = ", percentile75 / 1000.f, " msec");
    Logger.Info("One-way 95% percentile latency = ", percentile95 / 1000.f, " msec");
    Logger.Info("One-way 99% percentile latency = ", percentile99 / 1000.f, " msec");
}